

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Part_Man_t * Part_ManStart(int nChunkSize,int nStepSize)

{
  Part_Man_t *__s;
  Vec_Ptr_t *pVVar1;
  Part_Man_t *p;
  int nStepSize_local;
  int nChunkSize_local;
  
  __s = (Part_Man_t *)malloc(0x28);
  memset(__s,0,0x28);
  __s->nChunkSize = nChunkSize;
  __s->nStepSize = nStepSize;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vMemory = pVVar1;
  pVVar1 = Vec_PtrAlloc(1000);
  __s->vFree = pVVar1;
  return __s;
}

Assistant:

Part_Man_t * Part_ManStart( int nChunkSize, int nStepSize )
{
    Part_Man_t * p;
    p = ABC_ALLOC( Part_Man_t, 1 );
    memset( p, 0, sizeof(Part_Man_t) );
    p->nChunkSize = nChunkSize;
    p->nStepSize  = nStepSize;
    p->vMemory    = Vec_PtrAlloc( 1000 );
    p->vFree      = Vec_PtrAlloc( 1000 );
    return p;
}